

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::ParquetWriteSelect
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,CopyToSelectInput *input)

{
  LogicalTypeId LVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 uVar5;
  CopyToType CVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  pointer pEVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *pvVar11;
  LogicalType *pLVar12;
  LogicalType *pLVar13;
  idx_t iVar14;
  uint uVar15;
  anon_class_1_0_00000001 *func;
  uint *func_00;
  LogicalType *extraout_RDX;
  LogicalType *extraout_RDX_00;
  LogicalType *type;
  LogicalType *extraout_RDX_01;
  LogicalType *extraout_RDX_02;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *type_02;
  LogicalType *extraout_RDX_03;
  LogicalType *extraout_RDX_04;
  LogicalType *type_03;
  LogicalType *type_04;
  LogicalType *type_05;
  LogicalType *type_06;
  LogicalType *extraout_RDX_05;
  LogicalType *extraout_RDX_06;
  LogicalType *type_07;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar16;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  pointer this;
  TypeVisitor *pTVar18;
  element_type *peVar19;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType new_type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  LogicalType local_e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c0;
  ClientContext *local_b8;
  LogicalType local_b0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_98;
  CopyToSelectInput *local_80;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_78;
  pointer local_70;
  LogicalType local_68;
  string local_50;
  
  local_98.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (input->select_list).
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (input->select_list).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pvVar16 = __return_storage_ptr__;
  local_80 = input;
  if (this != local_70) {
    bVar8 = false;
    local_b8 = input->context;
    local_78 = __return_storage_ptr__;
    do {
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                (this);
      pLVar12 = &pEVar10->return_type;
      CVar6 = local_80->copy_to_type;
      if (CVar6 == COPY_TO_FILE) {
        if (pLVar12->id_ != BLOB) goto LAB_01b3f4fa;
        bVar7 = LogicalType::HasAlias(pLVar12);
        if (!bVar7) {
LAB_01b3fa56:
          CVar6 = local_80->copy_to_type;
          goto LAB_01b3f3c4;
        }
        LogicalType::GetAlias_abi_cxx11_((string *)local_120,pLVar12);
        iVar9 = ::std::__cxx11::string::compare((char *)local_120);
        if (iVar9 == 0) {
          bVar7 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled(local_b8);
        }
        else {
          bVar7 = false;
        }
        if ((pointer)local_120._0_8_ != (pointer)local_110) {
          operator_delete((void *)local_120._0_8_);
        }
        if (bVar7 == false) goto LAB_01b3fa56;
        LogicalType::LogicalType((LogicalType *)local_120,BLOB);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"WKB_BLOB","");
        LogicalType::SetAlias((LogicalType *)local_120,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        local_c0._M_head_impl =
             (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&local_138,local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_c0,(LogicalType *)local_120,false);
        if (local_c0._M_head_impl != (Expression *)0x0) {
          (*((local_c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_c0._M_head_impl = (Expression *)0x0;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_138._M_allocated_capacity);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_98,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_138._M_allocated_capacity);
        plVar4 = (long *)CONCAT62(local_138._M_allocated_capacity._2_6_,
                                  CONCAT11(local_138._M_local_buf[1],local_138._M_local_buf[0]));
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        pLVar12 = (LogicalType *)local_120;
        goto LAB_01b3fddc;
      }
LAB_01b3f3c4:
      if ((CVar6 != EXPORT_DATABASE) ||
         (bVar7 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar12,IsTypeLossy),
         !bVar7)) {
LAB_01b3f4fa:
        bVar7 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>
                          (pLVar12,IsTypeNotSupported);
        if (!bVar7) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_98,this);
          goto LAB_01b3fde3;
        }
        func_00 = &switchD_01b3f530::switchdataD_01e20f14;
        switch(pLVar12->id_) {
        case STRUCT:
          pvVar11 = &StructType::GetChildTypes_abi_cxx11_(pLVar12)->
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ;
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_120,pvVar11);
          uVar5 = local_120._8_8_;
          if (local_120._0_8_ != local_120._8_8_) {
            pLVar12 = extraout_RDX_01;
            pTVar18 = (TypeVisitor *)(local_120._0_8_ + 0x20);
            do {
              TypeVisitor::
              VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                        ((LogicalType *)&local_138,pTVar18,pLVar12,
                         (anon_class_1_0_00000001 *)func_00);
              *pTVar18 = (TypeVisitor)local_138._M_local_buf[0];
              pTVar18[1] = (TypeVisitor)local_138._M_local_buf[1];
              uVar2 = *(undefined8 *)(pTVar18 + 8);
              uVar3 = *(undefined8 *)(pTVar18 + 0x10);
              *(undefined8 *)(pTVar18 + 8) = local_138._8_8_;
              *(undefined8 *)(pTVar18 + 0x10) = uStack_128;
              local_138._8_8_ = uVar2;
              uStack_128 = uVar3;
              LogicalType::~LogicalType((LogicalType *)&local_138);
              peVar19 = (element_type *)(pTVar18 + 0x18);
              pLVar12 = extraout_RDX_02;
              pTVar18 = pTVar18 + 0x38;
            } while (peVar19 != (element_type *)uVar5);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)(local_110 + 0x10),
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_120);
          LogicalType::STRUCT((LogicalType *)&local_138,
                              (child_list_t<LogicalType> *)(local_110 + 0x10));
          if ((((byte)local_138._M_local_buf[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_138._M_local_buf[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)&local_138,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
          break;
        case LIST:
          pLVar12 = ListType::GetChildType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_120,pLVar12);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    ((LogicalType *)(local_110 + 0x10),(TypeVisitor *)local_120,type_02,
                     (anon_class_1_0_00000001 *)func_00);
          LogicalType::LIST((LogicalType *)&local_138,(LogicalType *)(local_110 + 0x10));
          if ((((byte)local_138._M_local_buf[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_138._M_local_buf[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)&local_138,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
          goto LAB_01b3f8a9;
        case MAP:
          pLVar13 = MapType::KeyType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_120,pLVar13);
          pLVar12 = MapType::ValueType(pLVar12);
          LogicalType::LogicalType((LogicalType *)&local_138,pLVar12);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_b0,(TypeVisitor *)local_120,type_00,(anon_class_1_0_00000001 *)func_00);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_68,(TypeVisitor *)local_138._M_local_buf,type_01,
                     (anon_class_1_0_00000001 *)func_00);
          LogicalType::MAP((LogicalType *)(local_110 + 0x10),&local_b0,&local_68);
          if ((((byte)local_100._M_local_buf[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_100._M_local_buf[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)(local_110 + 0x10),
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType
                      ((LogicalType *)(local_110 + 0x28),(LogicalType *)(local_110 + 0x10));
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
          LogicalType::~LogicalType((LogicalType *)(local_110 + 0x10));
          LogicalType::~LogicalType(&local_68);
          LogicalType::~LogicalType(&local_b0);
          paVar17 = &local_138;
          goto LAB_01b3f8b6;
        default:
          uVar15 = (uint)(pEVar10->return_type).physical_type_;
          if (((uVar15 < 0x1e) && ((0x21800000U >> (uVar15 & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                (pLVar12,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8
             )) {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),pLVar12);
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
          goto LAB_01b3f8c8;
        case UNION:
          UnionType::CopyMemberTypes_abi_cxx11_
                    ((child_list_t<LogicalType> *)local_120,(UnionType *)pLVar12,type);
          uVar5 = local_120._8_8_;
          if (local_120._0_8_ != local_120._8_8_) {
            pLVar12 = extraout_RDX_03;
            pTVar18 = (TypeVisitor *)(local_120._0_8_ + 0x20);
            do {
              TypeVisitor::
              VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                        ((LogicalType *)&local_138,pTVar18,pLVar12,
                         (anon_class_1_0_00000001 *)func_00);
              *pTVar18 = (TypeVisitor)local_138._M_local_buf[0];
              pTVar18[1] = (TypeVisitor)local_138._M_local_buf[1];
              uVar2 = *(undefined8 *)(pTVar18 + 8);
              uVar3 = *(undefined8 *)(pTVar18 + 0x10);
              *(undefined8 *)(pTVar18 + 8) = local_138._8_8_;
              *(undefined8 *)(pTVar18 + 0x10) = uStack_128;
              local_138._8_8_ = uVar2;
              uStack_128 = uVar3;
              LogicalType::~LogicalType((LogicalType *)&local_138);
              peVar19 = (element_type *)(pTVar18 + 0x18);
              pLVar12 = extraout_RDX_04;
              pTVar18 = pTVar18 + 0x38;
            } while (peVar19 != (element_type *)uVar5);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)(local_110 + 0x10),
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_120);
          LogicalType::UNION((LogicalType *)&local_138,
                             (child_list_t<LogicalType> *)(local_110 + 0x10));
          if ((((byte)local_138._M_local_buf[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_138._M_local_buf[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)&local_138,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
          break;
        case ARRAY:
          pLVar13 = ArrayType::GetChildType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_120,pLVar13);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    ((LogicalType *)(local_110 + 0x10),(TypeVisitor *)local_120,type_03,
                     (anon_class_1_0_00000001 *)func_00);
          iVar14 = ArrayType::GetSize(pLVar12);
          optional_idx::optional_idx((optional_idx *)&local_b0,iVar14);
          LogicalType::ARRAY((LogicalType *)&local_138,(LogicalType *)(local_110 + 0x10),
                             (optional_idx)local_b0._0_8_);
          if ((((byte)local_138._M_local_buf[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_138._M_local_buf[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)&local_138,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
          }
          else {
            LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
          }
LAB_01b3f8a9:
          LogicalType::~LogicalType((LogicalType *)&local_138);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_110 + 0x10);
LAB_01b3f8b6:
          LogicalType::~LogicalType((LogicalType *)paVar17);
          LogicalType::~LogicalType((LogicalType *)local_120);
          goto LAB_01b3f8c8;
        }
        LogicalType::~LogicalType((LogicalType *)&local_138);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)(local_110 + 0x10));
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)local_120);
LAB_01b3f8c8:
        local_d0._M_head_impl =
             (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_120,local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_d0,(LogicalType *)(local_110 + 0x28),false);
        if ((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
            local_d0._M_head_impl != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
          (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_d0._M_head_impl = (Expression *)0x0;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_120);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_98,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_120);
        goto LAB_01b3fdc7;
      }
      LVar1 = pLVar12->id_;
      uVar15 = LVar1 - 100;
      if (8 < uVar15) {
switchD_01b3f402_caseD_67:
        if ((byte)(LVar1 - UHUGEINT) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),pLVar12);
        }
        goto LAB_01b3fd55;
      }
      func = (anon_class_1_0_00000001 *)
             ((long)&switchD_01b3f402::switchdataD_01e20f38 +
             (long)(int)(&switchD_01b3f402::switchdataD_01e20f38)[uVar15]);
      switch((uint)LVar1) {
      case 100:
        pvVar11 = &StructType::GetChildTypes_abi_cxx11_(pLVar12)->
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_120,pvVar11);
        uVar5 = local_120._8_8_;
        if (local_120._0_8_ != local_120._8_8_) {
          pLVar12 = extraout_RDX;
          pTVar18 = (TypeVisitor *)(local_120._0_8_ + 0x20);
          do {
            TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                      ((LogicalType *)&local_138,pTVar18,pLVar12,func);
            *pTVar18 = (TypeVisitor)local_138._M_local_buf[0];
            pTVar18[1] = (TypeVisitor)local_138._M_local_buf[1];
            uVar2 = *(undefined8 *)(pTVar18 + 8);
            uVar3 = *(undefined8 *)(pTVar18 + 0x10);
            *(undefined8 *)(pTVar18 + 8) = local_138._8_8_;
            *(undefined8 *)(pTVar18 + 0x10) = uStack_128;
            local_138._8_8_ = uVar2;
            uStack_128 = uVar3;
            LogicalType::~LogicalType((LogicalType *)&local_138);
            peVar19 = (element_type *)(pTVar18 + 0x18);
            pLVar12 = extraout_RDX_00;
            pTVar18 = pTVar18 + 0x38;
          } while (peVar19 != (element_type *)uVar5);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)(local_110 + 0x10),
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_120);
        LogicalType::STRUCT((LogicalType *)&local_138,
                            (child_list_t<LogicalType> *)(local_110 + 0x10));
        if ((byte)(local_138._M_local_buf[0] - 0x31U) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
        }
        break;
      case 0x65:
        pLVar12 = ListType::GetChildType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_120,pLVar12);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  ((LogicalType *)(local_110 + 0x10),(TypeVisitor *)local_120,type_06,func);
        LogicalType::LIST((LogicalType *)&local_138,(LogicalType *)(local_110 + 0x10));
        if ((byte)(local_138._M_local_buf[0] - 0x31U) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
        }
        goto LAB_01b3fcba;
      case 0x66:
        pLVar13 = MapType::KeyType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_120,pLVar13);
        pLVar12 = MapType::ValueType(pLVar12);
        LogicalType::LogicalType((LogicalType *)&local_138,pLVar12);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_b0,(TypeVisitor *)local_120,type_04,func);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_68,(TypeVisitor *)local_138._M_local_buf,type_05,func);
        LogicalType::MAP((LogicalType *)(local_110 + 0x10),&local_b0,&local_68);
        if ((byte)(local_100._M_local_buf[0] - 0x31U) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType
                    ((LogicalType *)(local_110 + 0x28),(LogicalType *)(local_110 + 0x10));
        }
        LogicalType::~LogicalType((LogicalType *)(local_110 + 0x10));
        LogicalType::~LogicalType(&local_68);
        LogicalType::~LogicalType(&local_b0);
        paVar17 = &local_138;
        goto LAB_01b3fd00;
      default:
        goto switchD_01b3f402_caseD_67;
      case 0x6b:
        UnionType::CopyMemberTypes_abi_cxx11_
                  ((child_list_t<LogicalType> *)local_120,(UnionType *)pLVar12,
                   (LogicalType *)&switchD_01b3f402::switchdataD_01e20f38);
        uVar5 = local_120._8_8_;
        if (local_120._0_8_ != local_120._8_8_) {
          pLVar12 = extraout_RDX_05;
          pTVar18 = (TypeVisitor *)(local_120._0_8_ + 0x20);
          do {
            TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                      ((LogicalType *)&local_138,pTVar18,pLVar12,func);
            *pTVar18 = (TypeVisitor)local_138._M_local_buf[0];
            pTVar18[1] = (TypeVisitor)local_138._M_local_buf[1];
            uVar2 = *(undefined8 *)(pTVar18 + 8);
            uVar3 = *(undefined8 *)(pTVar18 + 0x10);
            *(undefined8 *)(pTVar18 + 8) = local_138._8_8_;
            *(undefined8 *)(pTVar18 + 0x10) = uStack_128;
            local_138._8_8_ = uVar2;
            uStack_128 = uVar3;
            LogicalType::~LogicalType((LogicalType *)&local_138);
            peVar19 = (element_type *)(pTVar18 + 0x18);
            pLVar12 = extraout_RDX_06;
            pTVar18 = pTVar18 + 0x38;
          } while (peVar19 != (element_type *)uVar5);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)(local_110 + 0x10),
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_120);
        LogicalType::UNION((LogicalType *)&local_138,(child_list_t<LogicalType> *)(local_110 + 0x10)
                          );
        if ((byte)(local_138._M_local_buf[0] - 0x31U) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
        }
        break;
      case 0x6c:
        pLVar13 = ArrayType::GetChildType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_120,pLVar13);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  ((LogicalType *)(local_110 + 0x10),(TypeVisitor *)local_120,type_07,func);
        iVar14 = ArrayType::GetSize(pLVar12);
        optional_idx::optional_idx((optional_idx *)&local_b0,iVar14);
        LogicalType::ARRAY((LogicalType *)&local_138,(LogicalType *)(local_110 + 0x10),
                           (optional_idx)local_b0._0_8_);
        if ((byte)(local_138._M_local_buf[0] - 0x31U) < 2) {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),VARCHAR);
        }
        else {
          LogicalType::LogicalType((LogicalType *)(local_110 + 0x28),(LogicalType *)&local_138);
        }
LAB_01b3fcba:
        LogicalType::~LogicalType((LogicalType *)&local_138);
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_110 + 0x10);
LAB_01b3fd00:
        LogicalType::~LogicalType((LogicalType *)paVar17);
        LogicalType::~LogicalType((LogicalType *)local_120);
        goto LAB_01b3fd55;
      }
      LogicalType::~LogicalType((LogicalType *)&local_138);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)(local_110 + 0x10));
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)local_120);
LAB_01b3fd55:
      local_c8._M_head_impl =
           (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_120,local_b8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_c8,(LogicalType *)(local_110 + 0x28),false);
      if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_c8._M_head_impl != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*((local_c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_c8._M_head_impl = (Expression *)0x0;
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_120);
      ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_98,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_120);
LAB_01b3fdc7:
      if ((pointer)local_120._0_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_120._0_8_ + 8))();
      }
      pLVar12 = (LogicalType *)(local_110 + 0x28);
LAB_01b3fddc:
      LogicalType::~LogicalType(pLVar12);
      bVar8 = true;
LAB_01b3fde3:
      this = this + 1;
    } while (this != local_70);
    __return_storage_ptr__ = local_78;
    pvVar16 = local_78;
    if (bVar8) {
      (local_78->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_98.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_78->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_78->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __return_storage_ptr__ = &local_98;
    }
  }
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_98);
  return pvVar16;
}

Assistant:

static vector<unique_ptr<Expression>> ParquetWriteSelect(CopyToSelectInput &input) {

	auto &context = input.context;

	vector<unique_ptr<Expression>> result;

	bool any_change = false;

	for (auto &expr : input.select_list) {

		const auto &type = expr->return_type;
		const auto &name = expr->GetAlias();

		// Spatial types need to be encoded into WKB when writing GeoParquet.
		// But dont perform this conversion if this is a EXPORT DATABASE statement
		if (input.copy_to_type == CopyToType::COPY_TO_FILE && type.id() == LogicalTypeId::BLOB && type.HasAlias() &&
		    type.GetAlias() == "GEOMETRY" && GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {

			LogicalType wkb_blob_type(LogicalTypeId::BLOB);
			wkb_blob_type.SetAlias("WKB_BLOB");

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), wkb_blob_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// If this is an EXPORT DATABASE statement, we dont want to write "lossy" types, instead cast them to VARCHAR
		else if (input.copy_to_type == CopyToType::EXPORT_DATABASE && TypeVisitor::Contains(type, IsTypeLossy)) {
			// Replace all lossy types with VARCHAR
			auto new_type = TypeVisitor::VisitReplace(
			    type, [](const LogicalType &ty) -> LogicalType { return IsTypeLossy(ty) ? LogicalType::VARCHAR : ty; });

			// Cast the column to the new type
			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Else look if there is any unsupported type
		else if (TypeVisitor::Contains(type, IsTypeNotSupported)) {
			// If there is at least one unsupported type, replace all unsupported types with varchar
			// and perform a CAST
			auto new_type = TypeVisitor::VisitReplace(type, [](const LogicalType &ty) -> LogicalType {
				return IsTypeNotSupported(ty) ? LogicalType::VARCHAR : ty;
			});

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Otherwise, just reference the input column
		else {
			result.push_back(std::move(expr));
		}
	}

	// If any change was made, return the new expressions
	// otherwise, return an empty vector to indicate no change and avoid pushing another projection on to the plan
	if (any_change) {
		return result;
	}
	return {};
}